

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode_compare.hpp
# Opt level: O3

bool jessilib::equals<char16_t,char8_t>
               (basic_string_view<char16_t,_std::char_traits<char16_t>_> lhs,
               basic_string_view<char8_t,_std::char_traits<char8_t>_> rhs)

{
  jessilib *pjVar1;
  jessilib *this;
  char32_t cVar2;
  char16_t *pcVar3;
  size_t sVar4;
  long lVar5;
  char8_t *pcVar6;
  decode_result dVar7;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> in_string;
  
  pcVar3 = lhs._M_str;
  sVar4 = lhs._M_len;
  pcVar6 = rhs._M_str;
  this = (jessilib *)rhs._M_len;
  pjVar1 = this;
  while( true ) {
    if (sVar4 == 0) {
      return this == (jessilib *)0x0;
    }
    if (this == (jessilib *)0x0) break;
    cVar2 = (char32_t)(ushort)*pcVar3;
    lVar5 = 1;
    if (((sVar4 != 1) && ((cVar2 & 0xfc00U) == 0xd800)) && (((ushort)pcVar3[1] & 0xfc00) == 0xdc00))
    {
      cVar2 = (uint)(ushort)*pcVar3 * 0x400 + (uint)(ushort)pcVar3[1] + L'\xfca02400';
      lVar5 = 2;
    }
    in_string._M_str = (char8_t *)pjVar1;
    in_string._M_len = (size_t)pcVar6;
    dVar7 = decode_codepoint_utf8<char8_t>(this,in_string);
    pjVar1 = (jessilib *)dVar7.units;
    if (pjVar1 == (jessilib *)0x0) {
      return false;
    }
    if (cVar2 != dVar7.codepoint) {
      return false;
    }
    pcVar3 = pcVar3 + lVar5;
    pcVar6 = pcVar6 + (long)pjVar1;
    this = this + -(long)pjVar1;
    sVar4 = sVar4 - lVar5;
  }
  return false;
}

Assistant:

bool equals(std::basic_string_view<LhsCharT> lhs, std::basic_string_view<RhsCharT> rhs) {
	// If lhs and rhs are the same type, compare their sizes and quickly return if not same
	if constexpr (std::is_same_v<LhsCharT, RhsCharT>) {
		return lhs == rhs;
	}

	while (!lhs.empty() && !rhs.empty()) {
		auto lhs_front = decode_codepoint(lhs);
		auto rhs_front = decode_codepoint(rhs);

		if (lhs_front.units == 0
			|| rhs_front.units == 0) {
			// Failed to decode front codepoint; bad unicode sequence
			return false;
		}

		if (lhs_front.codepoint != rhs_front.codepoint) {
			// Codepoints aren't the same
			return false;
		}

		// Codepoints are equal; trim off the fronts and continue
		lhs.remove_prefix(lhs_front.units);
		rhs.remove_prefix(rhs_front.units);
	}

	return lhs.empty() && rhs.empty();
}